

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O2

void mi_page_queue_push(mi_heap_t *heap,mi_page_queue_t *queue,mi_page_t *page)

{
  mi_page_s *pmVar1;
  mi_page_s **ppmVar2;
  
  (page->flags).full_aligned = (page->flags).full_aligned & 0xfe | queue->block_size == 0x10010;
  pmVar1 = queue->first;
  page->next = pmVar1;
  page->prev = (mi_page_s *)0x0;
  ppmVar2 = &pmVar1->prev;
  if (pmVar1 == (mi_page_s *)0x0) {
    ppmVar2 = &queue->last;
  }
  *ppmVar2 = page;
  queue->first = page;
  mi_heap_queue_first_update(heap,queue);
  heap->page_count = heap->page_count + 1;
  return;
}

Assistant:

static void mi_page_queue_push(mi_heap_t* heap, mi_page_queue_t* queue, mi_page_t* page) {
  mi_assert_internal(mi_page_heap(page) == heap);
  mi_assert_internal(!mi_page_queue_contains(queue, page));
  #if MI_HUGE_PAGE_ABANDON
  mi_assert_internal(_mi_page_segment(page)->kind != MI_SEGMENT_HUGE);
  #endif
  mi_assert_internal(mi_page_block_size(page) == queue->block_size ||
                      (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(queue)) ||
                        (mi_page_is_in_full(page) && mi_page_queue_is_full(queue)));

  mi_page_set_in_full(page, mi_page_queue_is_full(queue));
  // mi_atomic_store_ptr_release(mi_atomic_cast(void*, &page->heap), heap);
  page->next = queue->first;
  page->prev = NULL;
  if (queue->first != NULL) {
    mi_assert_internal(queue->first->prev == NULL);
    queue->first->prev = page;
    queue->first = page;
  }
  else {
    queue->first = queue->last = page;
  }

  // update direct
  mi_heap_queue_first_update(heap, queue);
  heap->page_count++;
}